

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  double *pdVar3;
  void *returnvalue;
  void *returnvalue_00;
  undefined8 *puVar4;
  undefined8 *puVar5;
  double *pdVar6;
  char **unaff_RBX;
  char **ppcVar7;
  char *__format;
  long lVar8;
  long lVar9;
  int jx;
  char *unaff_R15;
  bool bVar10;
  double dVar11;
  double dVar12;
  int retval;
  uint local_11c;
  char *local_118;
  int local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined8 local_100;
  int retval_1;
  undefined4 uStack_f4;
  undefined8 *local_f0;
  undefined8 *local_e8;
  void *local_e0;
  SUNContext sunctx;
  char *local_d0;
  int qu;
  undefined4 uStack_c4;
  long nfe;
  long nst;
  int local_ac;
  sunrealtype t;
  void *cvode_mem;
  long netfS;
  long ncfnS;
  long nniS;
  void *local_80;
  long nps;
  long npe;
  long ncfl;
  long nli;
  long nsetupsS;
  long nfeS;
  long nfSe;
  long netf;
  long ncfn;
  
  cvode_mem = (void *)0x0;
  if (argc < 2) {
LAB_00102f67:
    WrongArgs(*argv);
LAB_00102f6f:
    local_104 = CVodeGetSensNumErrTestFails(local_118,&netfS);
    check_retval(&local_104,"CVodeGetSensNumErrTestFails",1);
  }
  else {
    unaff_R15 = argv[1];
    local_10c = strcmp(unaff_R15,"-nosensi");
    if (local_10c == 0) {
      local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
      local_108 = 1;
      local_11c = 0xffffffff;
      goto LAB_0010262e;
    }
    iVar1 = strcmp(unaff_R15,"-sensi");
    if ((iVar1 != 0) || (argc != 4)) goto LAB_00102f67;
    unaff_R15 = argv[2];
    iVar1 = strcmp(unaff_R15,"sim");
    if (iVar1 == 0) {
      local_11c = 1;
    }
    else {
      iVar1 = strcmp(unaff_R15,"stg");
      if (iVar1 == 0) {
        local_11c = 2;
      }
      else {
        iVar1 = strcmp(unaff_R15,"stg1");
        if (iVar1 != 0) goto LAB_00102f67;
        local_11c = 3;
      }
    }
    pcVar2 = argv[3];
    if (*pcVar2 == 'f') {
      local_100 = (double)((ulong)local_100._4_4_ << 0x20);
      local_108 = 1;
      if (pcVar2[1] != '\0') goto LAB_00102f67;
    }
    else {
      if ((*pcVar2 != 't') || (pcVar2[1] != '\0')) goto LAB_00102f67;
      local_100 = (double)CONCAT44(local_100._4_4_,1);
      local_108 = 0;
    }
LAB_0010262e:
    argv = (char **)malloc(0x1558);
    unaff_RBX = argv + 0x1c3;
    ppcVar7 = unaff_RBX;
    for (lVar9 = 0; lVar9 != 0xf; lVar9 = lVar9 + 1) {
      for (lVar8 = 0; lVar8 != 0xf; lVar8 = lVar8 + 1) {
        pcVar2 = (char *)SUNDlsMat_newDenseMat(2,2);
        ppcVar7[lVar8 + -0x1c2] = pcVar2;
        pcVar2 = (char *)SUNDlsMat_newDenseMat(2,2);
        ppcVar7[lVar8 + -0xe1] = pcVar2;
        pcVar2 = (char *)SUNDlsMat_newIndexArray(2);
        ppcVar7[lVar8] = pcVar2;
      }
      ppcVar7 = ppcVar7 + 0xf;
    }
    pcVar2 = (char *)malloc(0x40);
    *argv = pcVar2;
    iVar1 = check_retval(argv,"AllocUserData",2);
    if (iVar1 != 0) {
      return 1;
    }
    argv[0x2a5] = (char *)0x3f13104b57cf96af;
    argv[0x2a6] = (char *)0x3ff6db6db6db6db7;
    argv[0x2a7] = (char *)0x3ff6db6db6db6db7;
    argv[0x2a8] = (char *)0x3ec07111652d2b5c;
    argv[0x2a9] = (char *)0x3f36f0068db8bac7;
    argv[0x2aa] = (char *)0x3e350b9b62c92d43;
    pcVar2 = *argv;
    pcVar2[0] = '-';
    pcVar2[1] = -0x3e;
    pcVar2[2] = '1';
    pcVar2[3] = 'y';
    pcVar2[4] = -0x5d;
    pcVar2[5] = '}';
    pcVar2[6] = -0x59;
    pcVar2[7] = '<';
    pcVar2[8] = -0x69;
    pcVar2[9] = '_';
    pcVar2[10] = -8;
    pcVar2[0xb] = 'c';
    pcVar2[0xc] = '\x17';
    pcVar2[0xd] = -0x36;
    pcVar2[0xe] = -0x40;
    pcVar2[0xf] = '<';
    pcVar2[0x10] = '\0';
    pcVar2[0x11] = '\x10';
    pcVar2[0x12] = '\x16';
    pcVar2[0x13] = -0x46;
    pcVar2[0x14] = 'i';
    pcVar2[0x15] = 'n';
    pcVar2[0x16] = '`';
    pcVar2[0x17] = 'C';
    pcVar2[0x18] = '\x1f';
    pcVar2[0x19] = -0x7b;
    pcVar2[0x1a] = -0x15;
    pcVar2[0x1b] = 'Q';
    pcVar2[0x1c] = -0x48;
    pcVar2[0x1d] = -0x62;
    pcVar2[0x1e] = '6';
    pcVar2[0x1f] = '@';
    pcVar2[0x20] = -0x7f;
    pcVar2[0x21] = -0x6b;
    pcVar2[0x22] = 'C';
    pcVar2[0x23] = -0x75;
    pcVar2[0x24] = 'l';
    pcVar2[0x25] = 'g';
    pcVar2[0x26] = '\x1e';
    pcVar2[0x27] = '@';
    pcVar2[0x28] = -0x73;
    pcVar2[0x29] = -0x13;
    pcVar2[0x2a] = -0x4b;
    pcVar2[0x2b] = -0x60;
    pcVar2[0x2c] = -9;
    pcVar2[0x2d] = -0x3a;
    pcVar2[0x2e] = -0x30;
    pcVar2[0x2f] = '>';
    pcVar2[0x30] = -4;
    pcVar2[0x31] = -0x57;
    pcVar2[0x32] = -0xf;
    pcVar2[0x33] = -0x2e;
    pcVar2[0x34] = 'M';
    pcVar2[0x35] = 'b';
    pcVar2[0x36] = 'P';
    pcVar2[0x37] = '?';
    pcVar2[0x38] = ':';
    pcVar2[0x39] = -0x74;
    pcVar2[0x3a] = '0';
    pcVar2[0x3b] = -0x1e;
    pcVar2[0x3c] = -0x72;
    pcVar2[0x3d] = 'y';
    pcVar2[0x3e] = 'E';
    pcVar2[0x3f] = '>';
    retval = SUNContext_Create(0,&sunctx);
    iVar1 = check_retval(&retval,"SUNContext_Create",1);
    if (iVar1 != 0) {
      return 1;
    }
    unaff_R15 = (char *)N_VNew_Serial(0x1c2,sunctx);
    iVar1 = check_retval(unaff_R15,"N_VNew_Serial",0);
    if (iVar1 != 0) {
      return 1;
    }
    local_d0 = argv[0x2a6];
    local_118 = argv[0x2a7];
    pdVar3 = (double *)N_VGetArrayPointer(unaff_R15);
    for (lVar9 = 0; lVar9 != 0xf; lVar9 = lVar9 + 1) {
      dVar11 = ((double)(int)lVar9 * (double)local_118 + 30.0 + -40.0) * 0.1;
      dVar11 = dVar11 * dVar11;
      dVar11 = dVar11 * dVar11 * 0.5 + (1.0 - dVar11);
      pdVar6 = pdVar3;
      for (lVar8 = 0; lVar8 != 0xf; lVar8 = lVar8 + 1) {
        dVar12 = ((double)(int)lVar8 * (double)local_d0 + 0.0 + -10.0) * 0.1;
        dVar12 = dVar12 * dVar12;
        dVar12 = dVar12 * dVar12 * 0.5 + (1.0 - dVar12);
        *pdVar6 = dVar12 * 1000000.0 * dVar11;
        pdVar6[1] = dVar12 * 1000000000000.0 * dVar11;
        pdVar6 = pdVar6 + 2;
      }
      pdVar3 = pdVar3 + 0x1e;
    }
    returnvalue = (void *)CVodeCreate(2,sunctx);
    cvode_mem = returnvalue;
    iVar1 = check_retval(returnvalue,"CVodeCreate",0);
    if (iVar1 != 0) {
      return 1;
    }
    retval = CVodeSetUserData(returnvalue,argv);
    iVar1 = check_retval(&retval,"CVodeSetUserData",1);
    if (iVar1 != 0) {
      return 1;
    }
    retval = CVodeSetMaxNumSteps(returnvalue,2000);
    iVar1 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
    if (iVar1 != 0) {
      return 1;
    }
    retval = CVodeInit(0,returnvalue,f,unaff_R15);
    iVar1 = check_retval(&retval,"CVodeInit",1);
    if (iVar1 != 0) {
      return 1;
    }
    retval = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,returnvalue);
    iVar1 = check_retval(&retval,"CVodeSStolerances",1);
    if (iVar1 != 0) {
      return 1;
    }
    returnvalue_00 = (void *)SUNLinSol_SPGMR(unaff_R15,1,0,sunctx);
    iVar1 = check_retval(returnvalue_00,"SUNLinSol_SPGMR",0);
    if (iVar1 != 0) {
      return 1;
    }
    retval = CVodeSetLinearSolver(returnvalue,returnvalue_00,0);
    iVar1 = check_retval(&retval,"CVodeSetLinearSolver",1);
    if (iVar1 != 0) {
      return 1;
    }
    local_118 = (char *)returnvalue;
    local_80 = returnvalue_00;
    retval = CVodeSetPreconditioner(returnvalue,Precond,PSolve);
    iVar1 = check_retval(&retval,"CVodeSetPreconditioner",1);
    if (iVar1 != 0) {
      return 1;
    }
    puts("\n2-species diurnal advection-diffusion problem");
    if (local_10c == 0) {
      local_e0 = (void *)0x0;
      pcVar2 = "Sensitivity: NO ";
      local_e8 = (undefined8 *)0x0;
      local_f0 = (undefined8 *)0x0;
    }
    else {
      local_e8 = (undefined8 *)malloc(8);
      iVar1 = check_retval(local_e8,"malloc",2);
      if (iVar1 != 0) {
        return 1;
      }
      *local_e8 = 0x100000000;
      local_e0 = malloc(0x10);
      iVar1 = check_retval(local_e0,"malloc",2);
      if (iVar1 != 0) {
        return 1;
      }
      pcVar2 = *argv;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        *(undefined8 *)((long)local_e0 + lVar9 * 8) =
             *(undefined8 *)(pcVar2 + (long)*(int *)((long)local_e8 + lVar9 * 4) * 8);
      }
      local_f0 = (undefined8 *)N_VCloneVectorArray(2,unaff_R15);
      iVar1 = check_retval(local_f0,"N_VCloneVectorArray",0);
      if (iVar1 != 0) {
        return 1;
      }
      for (lVar9 = 0; pcVar2 = local_118, lVar9 != 2; lVar9 = lVar9 + 1) {
        N_VConst(0,local_f0[lVar9]);
      }
      retval = CVodeSensInit1(local_118,2,local_11c,0,local_f0);
      iVar1 = check_retval(&retval,"CVodeSensInit",1);
      if (iVar1 != 0) {
        return 1;
      }
      retval = CVodeSensEEtolerances(pcVar2);
      iVar1 = check_retval(&retval,"CVodeSensEEtolerances",1);
      if (iVar1 != 0) {
        return 1;
      }
      retval = CVodeSetSensErrCon(pcVar2,(ulong)local_100 & 0xffffffff);
      iVar1 = check_retval(&retval,"CVodeSetSensErrCon",1);
      if (iVar1 != 0) {
        return 1;
      }
      retval = CVodeSetSensDQMethod(0,pcVar2,1);
      iVar1 = check_retval(&retval,"CVodeSetSensDQMethod",1);
      if (iVar1 != 0) {
        return 1;
      }
      retval = CVodeSetSensParams(pcVar2,*argv,local_e0,local_e8);
      iVar1 = check_retval(&retval,"CVodeSetSensParams",1);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Sensitivity: YES ");
      pcVar2 = "( STAGGERED1 +";
      if (local_11c == 2) {
        pcVar2 = "( STAGGERED +";
      }
      __format = "( SIMULTANEOUS +";
      if (local_11c != 1) {
        __format = pcVar2;
      }
      printf(__format);
      pcVar2 = " FULL ERROR CONTROL )";
      if ((char)local_108 != '\0') {
        pcVar2 = " PARTIAL ERROR CONTROL )";
      }
    }
    printf(pcVar2);
    puts("\n");
    puts("========================================================================");
    puts("     T     Q       H      NST                    Bottom left  Top right ");
    puts("========================================================================");
    local_100 = 7200.0;
    local_ac = 0xc;
    while (bVar10 = local_ac != 0, local_ac = local_ac + -1, bVar10) {
      retval = CVode(SUB84(local_100,0),local_118,unaff_R15,&t,1);
      iVar1 = check_retval(&retval,"CVode",1);
      if (iVar1 != 0) break;
      local_d0 = (char *)t;
      puVar4 = (undefined8 *)N_VGetArrayPointer(unaff_R15);
      pcVar2 = local_118;
      retval_1 = CVodeGetNumSteps(local_118,&nst);
      check_retval(&retval_1,"CVodeGetNumSteps",1);
      retval_1 = CVodeGetLastOrder(pcVar2,&qu);
      check_retval(&retval_1,"CVodeGetLastOrder",1);
      retval_1 = CVodeGetLastStep(pcVar2,&nfe);
      check_retval(&retval_1,"CVodeGetLastStep",1);
      printf("%8.3e %2d  %8.3e %5ld\n",(int)local_d0,nfe,(ulong)(uint)qu,nst);
      printf("                                Solution       ");
      printf("%12.4e %12.4e \n",(int)*puVar4,puVar4[0x1c0]);
      printf("                                               ");
      printf("%12.4e %12.4e \n",(int)puVar4[1],puVar4[0x1c1]);
      if (local_10c != 0) {
        retval = CVodeGetSens(local_118,&t,local_f0);
        iVar1 = check_retval(&retval,"CVodeGetSens",1);
        puVar4 = local_f0;
        if (iVar1 != 0) break;
        puVar5 = (undefined8 *)N_VGetArrayPointer(*local_f0);
        puts("                                ----------------------------------------");
        printf("                                Sensitivity 1  ");
        printf("%12.4e %12.4e \n",(int)*puVar5,puVar5[0x1c0]);
        printf("                                               ");
        printf("%12.4e %12.4e \n",(int)puVar5[1],puVar5[0x1c1]);
        puVar4 = (undefined8 *)N_VGetArrayPointer(puVar4[1]);
        puts("                                ----------------------------------------");
        printf("                                Sensitivity 2  ");
        printf("%12.4e %12.4e \n",(int)*puVar4,puVar4[0x1c0]);
        printf("                                               ");
        printf("%12.4e %12.4e \n",(int)puVar4[1],puVar4[0x1c1]);
      }
      puts("------------------------------------------------------------------------");
      local_100 = local_100 + 7200.0;
    }
    pcVar2 = local_118;
    local_104 = CVodeGetNumSteps(local_118,&nst);
    check_retval(&local_104,"CVodeGetNumSteps",1);
    local_104 = CVodeGetNumRhsEvals(pcVar2,&nfe);
    check_retval(&local_104,"CVodeGetNumRhsEvals",1);
    local_104 = CVodeGetNumLinSolvSetups(pcVar2,&qu);
    check_retval(&local_104,"CVodeGetNumLinSolvSetups",1);
    local_104 = CVodeGetNumErrTestFails(pcVar2,&netf);
    check_retval(&local_104,"CVodeGetNumErrTestFails",1);
    local_104 = CVodeGetNumNonlinSolvIters(pcVar2,&retval_1);
    check_retval(&local_104,"CVodeGetNumNonlinSolvIters",1);
    local_104 = CVodeGetNumNonlinSolvConvFails(pcVar2,&ncfn);
    check_retval(&local_104,"CVodeGetNumNonlinSolvConvFails",1);
    pcVar2 = local_118;
    if (local_10c == 0) goto LAB_00103011;
    local_104 = CVodeGetSensNumRhsEvals(local_118,&nfSe);
    check_retval(&local_104,"CVodeGetSensNumRhsEvals",1);
    local_104 = CVodeGetNumRhsEvalsSens(pcVar2,&nfeS);
    check_retval(&local_104,"CVodeGetNumRhsEvalsSens",1);
    local_104 = CVodeGetSensNumLinSolvSetups(pcVar2,&nsetupsS);
    check_retval(&local_104,"CVodeGetSensNumLinSolvSetups",1);
    if ((char)local_108 == '\0') goto LAB_00102f6f;
    netfS = 0;
  }
  pcVar2 = local_118;
  if ((local_11c & 0xfffffffe) == 2) {
    local_104 = CVodeGetSensNumNonlinSolvIters(local_118,&nniS);
    check_retval(&local_104,"CVodeGetSensNumNonlinSolvIters",1);
    local_104 = CVodeGetSensNumNonlinSolvConvFails(pcVar2,&ncfnS);
    check_retval(&local_104,"CVodeGetSensNumNonlinSolvConvFails",1);
  }
  else {
    nniS = 0;
    ncfnS = 0;
  }
LAB_00103011:
  pcVar2 = local_118;
  local_104 = CVodeGetNumLinIters(local_118,&nli);
  check_retval(&local_104,"CVodeGetNumLinIters",1);
  local_104 = CVodeGetNumLinConvFails(pcVar2,&ncfl);
  check_retval(&local_104,"CVodeGetNumLinConvFails",1);
  local_104 = CVodeGetNumPrecEvals(pcVar2,&npe);
  check_retval(&local_104,"CVodeGetNumPrecEvals",1);
  local_104 = CVodeGetNumPrecSolves(pcVar2,&nps);
  check_retval(&local_104,"CVodeGetNumPrecSolves",1);
  puts("\nFinal Statistics\n");
  printf("nst     = %5ld\n\n",nst);
  printf("nfe     = %5ld\n",nfe);
  printf("netf    = %5ld    nsetups  = %5ld\n",netf,CONCAT44(uStack_c4,qu));
  printf("nni     = %5ld    ncfn     = %5ld\n",CONCAT44(uStack_f4,retval_1),ncfn);
  if (local_10c != 0) {
    putchar(10);
    printf("nfSe    = %5ld    nfeS     = %5ld\n",nfSe,nfeS);
    printf("netfs   = %5ld    nsetupsS = %5ld\n",netfS,nsetupsS);
    printf("nniS    = %5ld    ncfnS    = %5ld\n",nniS,ncfnS);
  }
  putchar(10);
  printf("nli     = %5ld    ncfl     = %5ld\n",nli,ncfl);
  printf("npe     = %5ld    nps      = %5ld\n",npe,nps);
  N_VDestroy(unaff_R15);
  if (local_10c != 0) {
    N_VDestroyVectorArray(local_f0,2);
    free(local_e0);
    free(local_e8);
  }
  for (lVar9 = 0; lVar9 != 0xf; lVar9 = lVar9 + 1) {
    for (lVar8 = 0; lVar8 != 0xf; lVar8 = lVar8 + 1) {
      SUNDlsMat_destroyMat(unaff_RBX[lVar8 + -0x1c2]);
      SUNDlsMat_destroyMat(unaff_RBX[lVar8 + -0xe1]);
      SUNDlsMat_destroyArray(unaff_RBX[lVar8]);
    }
    unaff_RBX = unaff_RBX + 0xf;
  }
  free(*argv);
  free(argv);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(local_80);
  SUNContext_Free(&sunctx);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  void* cvode_mem;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype abstol, reltol, t, tout;
  N_Vector y;
  int iout, retval;

  sunrealtype* pbar;
  int is, *plist;
  N_Vector* uS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  pbar      = NULL;
  plist     = NULL;
  uS        = NULL;
  y         = NULL;
  data      = NULL;
  cvode_mem = NULL;
  LS        = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Problem parameters */
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial states */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  SetInitialProfiles(y, data->dx, data->dz);

  /* Tolerances */
  abstol = ATOL;
  reltol = RTOL;

  /* Create CVODES object */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeSetMaxNumSteps(cvode_mem, 2000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate CVODES memory */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create the SUNLinSol_SPGMR linear solver with left
     preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  printf("\n2-species diurnal advection-diffusion problem\n");

  /* Forward sensitivity analysis */
  if (sensi)
  {
    plist = (int*)malloc(NS * sizeof(int));
    if (check_retval((void*)plist, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { plist[is] = is; }

    pbar = (sunrealtype*)malloc(NS * sizeof(sunrealtype));
    if (check_retval((void*)pbar, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { pbar[is] = data->p[plist[is]]; }

    uS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)uS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, uS[is]); }

    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, NULL, uS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    retval = CVodeSetSensDQMethod(cvode_mem, CV_CENTERED, ZERO);
    if (check_retval(&retval, "CVodeSetSensDQMethod", 1)) { return (1); }

    retval = CVodeSetSensParams(cvode_mem, data->p, pbar, plist);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop over output points, call CVode, print results, test for error */

  printf("\n\n");
  printf("====================================================================="
         "===\n");
  printf("     T     Q       H      NST                    Bottom left  Top "
         "right \n");
  printf("====================================================================="
         "===\n");

  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }
    PrintOutput(cvode_mem, t, y);
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, uS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(uS);
    }

    printf("-------------------------------------------------------------------"
           "-----\n");
  }

  /* Print final statistics */
  PrintFinalStats(cvode_mem, sensi, err_con, sensi_meth);

  /* Free memory */
  N_VDestroy(y);
  if (sensi)
  {
    N_VDestroyVectorArray(uS, NS);
    free(pbar);
    free(plist);
  }
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}